

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O1

void writeWithCommas(raw_ostream *S,ArrayRef<char> Buffer)

{
  char *pcVar1;
  void *pvVar2;
  char *in_RCX;
  void *pvVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  void *__buf;
  
  pvVar3 = (void *)Buffer.Length;
  if (pvVar3 == (void *)0x0) {
    __assert_fail("!Buffer.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/NativeFormatting.cpp"
                  ,0x21,"void writeWithCommas(raw_ostream &, ArrayRef<char>)");
  }
  pvVar2 = (void *)((((long)pvVar3 - 1U) / 3) * -3 + (long)pvVar3);
  uVar5 = (long)pvVar3 - (long)pvVar2;
  __buf = pvVar2;
  if (pvVar3 < pvVar2) {
    __buf = pvVar3;
  }
  llvm::raw_ostream::write(S,(int)Buffer.Data,__buf,(size_t)in_RCX);
  if ((void *)((long)pvVar2 - 1U) < pvVar3) {
    if (0x5555555555555555 < uVar5 * -0x5555555555555555) {
      __assert_fail("Buffer.size() % 3 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/NativeFormatting.cpp"
                    ,0x29,"void writeWithCommas(raw_ostream &, ArrayRef<char>)");
    }
    if (uVar5 != 0) {
      pcVar4 = Buffer.Data + (long)pvVar2;
      pvVar3 = extraout_RDX;
      do {
        pcVar1 = S->OutBufCur;
        if (pcVar1 < S->OutBufEnd) {
          in_RCX = pcVar1 + 1;
          S->OutBufCur = in_RCX;
          *pcVar1 = ',';
        }
        else {
          llvm::raw_ostream::write(S,0x2c,pvVar3,(size_t)in_RCX);
        }
        llvm::raw_ostream::write(S,(int)pcVar4,(void *)0x3,(size_t)in_RCX);
        bVar6 = uVar5 < 3;
        uVar5 = uVar5 - 3;
        if (bVar6) goto LAB_00db1855;
        pcVar4 = pcVar4 + 3;
        pvVar3 = extraout_RDX_00;
      } while (uVar5 != 0);
    }
    return;
  }
LAB_00db1855:
  __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/ArrayRef.h"
                ,0xbc,"ArrayRef<T> llvm::ArrayRef<char>::drop_front(size_t) const [T = char]");
}

Assistant:

static void writeWithCommas(raw_ostream &S, ArrayRef<char> Buffer) {
  assert(!Buffer.empty());

  ArrayRef<char> ThisGroup;
  int InitialDigits = ((Buffer.size() - 1) % 3) + 1;
  ThisGroup = Buffer.take_front(InitialDigits);
  S.write(ThisGroup.data(), ThisGroup.size());

  Buffer = Buffer.drop_front(InitialDigits);
  assert(Buffer.size() % 3 == 0);
  while (!Buffer.empty()) {
    S << ',';
    ThisGroup = Buffer.take_front(3);
    S.write(ThisGroup.data(), 3);
    Buffer = Buffer.drop_front(3);
  }
}